

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_scanner.hpp
# Opt level: O3

void __thiscall
duckdb::BaseScanner::Process<duckdb::SkipResult>(BaseScanner *this,SkipResult *result)

{
  shared_ptr<duckdb::CSVStateMachine,_true> *this_00;
  ulong uVar1;
  char cVar2;
  char cVar3;
  byte bVar4;
  CSVState CVar5;
  CSVState CVar6;
  char cVar7;
  bool bVar8;
  idx_t iVar9;
  idx_t iVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  CSVStates *pCVar14;
  CSVStateMachine *pCVar15;
  CSVBufferHandle *pCVar16;
  idx_t iVar17;
  ulong uVar18;
  ulong uVar19;
  idx_t iVar20;
  
  this_00 = &this->state_machine;
  pCVar15 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
  cVar2 = (pCVar15->dialect_options).state_machine_options.escape.value;
  pCVar15 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
  if ((((pCVar15->state_machine_options).strict_mode.value == true) &&
      (pCVar15 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00),
      (pCVar15->state_machine_options).strict_mode.set_by_user == true)) &&
     (pCVar15 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00),
     (pCVar15->state_machine_options).new_line.value == CARRY_ON)) {
    pCVar15 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
    cVar3 = (pCVar15->state_machine_options).new_line.set_by_user;
  }
  else {
    cVar3 = '\0';
  }
  iVar9 = (this->iterator).pos.buffer_pos;
  if ((this->iterator).is_set == true) {
    iVar20 = (this->iterator).boundary.end_pos;
    pCVar16 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(&this->cur_buffer_handle);
    if (iVar20 <= pCVar16->actual_size) goto LAB_014f9fe1;
  }
  pCVar16 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(&this->cur_buffer_handle);
  iVar20 = pCVar16->actual_size;
LAB_014f9fe1:
  uVar19 = (this->iterator).pos.buffer_pos;
  if (uVar19 < iVar20) {
    uVar1 = iVar20 - 1;
    do {
      pCVar15 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
      iVar10 = (this->iterator).pos.buffer_pos;
      bVar4 = this->buffer_handle_ptr[iVar10];
      CVar5 = (this->states).states[1];
      (this->states).states[0] = CVar5;
      CVar6 = pCVar15->transition_array->state_machine[bVar4][CVar5];
      (this->states).states[1] = CVar6;
      switch(CVar6) {
      case STANDARD:
        iVar17 = iVar10 + 1;
        (this->iterator).pos.buffer_pos = iVar17;
        uVar19 = iVar10 + 9;
        while (uVar19 < iVar20) {
          uVar19 = *(ulong *)(this->buffer_handle_ptr + iVar17);
          pCVar15 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          uVar18 = pCVar15->transition_array->delimiter;
          pCVar15 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          uVar11 = pCVar15->transition_array->new_line;
          pCVar15 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          uVar12 = pCVar15->transition_array->carriage_return;
          pCVar15 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          uVar13 = pCVar15->transition_array->escape;
          pCVar15 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          uVar19 = (uVar19 ^ pCVar15->transition_array->comment) &
                   (uVar13 ^ uVar19) & (uVar12 ^ uVar19) & (uVar11 ^ uVar19) & (uVar18 ^ uVar19);
          if ((~(0x101010101010100 - uVar19 | uVar19) & 0x8080808080808080) != 0) break;
          iVar10 = (this->iterator).pos.buffer_pos;
          iVar17 = iVar10 + 8;
          (this->iterator).pos.buffer_pos = iVar17;
          uVar19 = iVar10 + 0x10;
        }
        pCVar15 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
        uVar19 = (this->iterator).pos.buffer_pos;
        if (uVar19 < uVar1) {
          cVar7 = pCVar15->transition_array->skip_standard[(byte)this->buffer_handle_ptr[uVar19]];
          while (cVar7 != '\0') {
            (this->iterator).pos.buffer_pos = uVar19 + 1;
            pCVar15 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
            uVar19 = (this->iterator).pos.buffer_pos;
            if (uVar1 <= uVar19) break;
            cVar7 = pCVar15->transition_array->skip_standard[(byte)this->buffer_handle_ptr[uVar19]];
          }
        }
        break;
      default:
        goto switchD_014fa049_caseD_1;
      case RECORD_SEPARATOR:
        if (CVar5 == NOT_SET) {
LAB_014fa1cf:
          if (((((result->super_ScannerResult).state_machine)->dialect_options).num_cols == 1) &&
             (uVar19 = result->row_count + 1, result->row_count = uVar19,
             result->rows_to_skip <= uVar19)) {
LAB_014fa50a:
            (this->iterator).pos.buffer_pos = iVar10 + 1;
            this->bytes_read = (iVar10 + 1) - iVar9;
            this->lines_read = this->lines_read + 1;
            return;
          }
        }
        else {
          if (CVar5 == CARRIAGE_RETURN) goto switchD_014fa049_caseD_1;
          if (CVar5 == RECORD_SEPARATOR) goto LAB_014fa1cf;
          bVar8 = (result->super_ScannerResult).comment;
          uVar18 = result->row_count + 1;
          result->row_count = uVar18;
          uVar19 = result->rows_to_skip;
          if (bVar8 == true) {
            (result->super_ScannerResult).comment = false;
          }
          if (uVar19 <= uVar18) goto LAB_014fa50a;
        }
        this->lines_read = this->lines_read + 1;
        goto switchD_014fa049_caseD_1;
      case CARRIAGE_RETURN:
        if (CVar5 == NOT_SET) {
LAB_014fa06f:
          if ((((result->super_ScannerResult).state_machine)->dialect_options).num_cols == 1) {
LAB_014fa081:
            uVar19 = result->row_count + 1;
            result->row_count = uVar19;
            if (result->rows_to_skip <= uVar19) goto LAB_014fa50a;
          }
        }
        else if (CVar5 != CARRIAGE_RETURN) {
          if (CVar5 == RECORD_SEPARATOR) goto LAB_014fa06f;
          if ((result->super_ScannerResult).comment == true) {
            uVar18 = result->row_count + 1;
            result->row_count = uVar18;
            uVar19 = result->rows_to_skip;
            (result->super_ScannerResult).comment = false;
            if (uVar19 <= uVar18) goto LAB_014fa50a;
          }
          else if (cVar3 == '\0') goto LAB_014fa081;
        }
        uVar19 = iVar10 + 1;
        (this->iterator).pos.buffer_pos = uVar19;
        this->lines_read = this->lines_read + 1;
        break;
      case QUOTED:
        if (((CVar5 == MAYBE_QUOTED) || (CVar5 == UNQUOTED)) && (cVar2 != '\0')) {
          this->ever_escaped = true;
          (result->super_ScannerResult).escaped = true;
        }
        this->ever_quoted = true;
        if ((result->super_ScannerResult).quoted == false) {
          (result->super_ScannerResult).quoted_position = iVar10;
        }
        (result->super_ScannerResult).quoted = true;
        (result->super_ScannerResult).unquoted = true;
        iVar17 = iVar10 + 1;
        (this->iterator).pos.buffer_pos = iVar17;
        uVar19 = iVar10 + 9;
        while (uVar19 < iVar20) {
          uVar19 = *(ulong *)(this->buffer_handle_ptr + iVar17);
          pCVar15 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          uVar18 = pCVar15->transition_array->quote;
          pCVar15 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          uVar19 = (uVar19 ^ pCVar15->transition_array->escape) & (uVar18 ^ uVar19);
          if ((~(0x101010101010100 - uVar19 | uVar19) & 0x8080808080808080) != 0) break;
          iVar10 = (this->iterator).pos.buffer_pos;
          iVar17 = iVar10 + 8;
          (this->iterator).pos.buffer_pos = iVar17;
          uVar19 = iVar10 + 0x10;
        }
        pCVar15 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
        uVar19 = (this->iterator).pos.buffer_pos;
        if (uVar19 < uVar1) {
          cVar7 = pCVar15->transition_array->skip_quoted[(byte)this->buffer_handle_ptr[uVar19]];
          while (cVar7 != '\0') {
            (this->iterator).pos.buffer_pos = uVar19 + 1;
            pCVar15 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
            uVar19 = (this->iterator).pos.buffer_pos;
            if (uVar1 <= uVar19) break;
            cVar7 = pCVar15->transition_array->skip_quoted[(byte)this->buffer_handle_ptr[uVar19]];
          }
        }
        break;
      case UNQUOTED:
        if (CVar5 == MAYBE_QUOTED) {
          this->ever_escaped = true;
          (result->super_ScannerResult).escaped = true;
        }
        pCVar14 = (result->super_ScannerResult).states;
        if (((pCVar14->states[0] == UNQUOTED) && (pCVar14->states[1] == UNQUOTED)) &&
           ((((result->super_ScannerResult).state_machine)->dialect_options).state_machine_options.
            escape.value != '\0')) {
          (result->super_ScannerResult).escaped = true;
        }
        (result->super_ScannerResult).quoted = true;
        goto switchD_014fa049_caseD_1;
      case ESCAPE:
      case UNQUOTED_ESCAPE:
      case ESCAPED_RETURN:
        (result->super_ScannerResult).escaped = true;
        this->ever_escaped = true;
switchD_014fa049_caseD_1:
        uVar19 = iVar10 + 1;
        (this->iterator).pos.buffer_pos = uVar19;
        break;
      case INVALID:
        uVar19 = iVar10 + 1;
        (this->iterator).pos.buffer_pos = uVar19;
        goto LAB_014fa4ef;
      case COMMENT:
        (result->super_ScannerResult).comment = true;
        iVar17 = iVar10 + 1;
        (this->iterator).pos.buffer_pos = iVar17;
        uVar19 = iVar10 + 9;
        while (uVar19 < iVar20) {
          uVar19 = *(ulong *)(this->buffer_handle_ptr + iVar17);
          pCVar15 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          uVar18 = pCVar15->transition_array->new_line;
          pCVar15 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          uVar19 = (uVar19 ^ pCVar15->transition_array->carriage_return) & (uVar18 ^ uVar19);
          if ((~(0x101010101010100 - uVar19 | uVar19) & 0x8080808080808080) != 0) break;
          iVar10 = (this->iterator).pos.buffer_pos;
          iVar17 = iVar10 + 8;
          (this->iterator).pos.buffer_pos = iVar17;
          uVar19 = iVar10 + 0x10;
        }
        pCVar15 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
        uVar19 = (this->iterator).pos.buffer_pos;
        if (uVar19 < uVar1) {
          cVar7 = pCVar15->transition_array->skip_comment[(byte)this->buffer_handle_ptr[uVar19]];
          while (cVar7 != '\0') {
            (this->iterator).pos.buffer_pos = uVar19 + 1;
            pCVar15 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
            uVar19 = (this->iterator).pos.buffer_pos;
            if (uVar1 <= uVar19) break;
            cVar7 = pCVar15->transition_array->skip_comment[(byte)this->buffer_handle_ptr[uVar19]];
          }
        }
      }
    } while (uVar19 < iVar20);
  }
LAB_014fa4ef:
  this->bytes_read = uVar19 - iVar9;
  return;
}

Assistant:

void Process(T &result) {
		idx_t to_pos;
		const bool has_escaped_value = state_machine->dialect_options.state_machine_options.escape != '\0';
		const bool only_rn_newlines =
		    state_machine->state_machine_options.strict_mode.GetValue() &&
		    state_machine->state_machine_options.strict_mode.IsSetByUser() &&
		    state_machine->state_machine_options.new_line.GetValue() == NewLineIdentifier::CARRY_ON &&
		    state_machine->state_machine_options.new_line.IsSetByUser();
		const idx_t start_pos = iterator.pos.buffer_pos;
		if (iterator.IsBoundarySet()) {
			to_pos = iterator.GetEndPos();
			if (to_pos > cur_buffer_handle->actual_size) {
				to_pos = cur_buffer_handle->actual_size;
			}
		} else {
			to_pos = cur_buffer_handle->actual_size;
		}
		while (iterator.pos.buffer_pos < to_pos) {
			state_machine->Transition(states, buffer_handle_ptr[iterator.pos.buffer_pos]);
			switch (states.states[1]) {
			case CSVState::INVALID:
				T::InvalidState(result);
				iterator.pos.buffer_pos++;
				bytes_read = iterator.pos.buffer_pos - start_pos;
				return;
			case CSVState::RECORD_SEPARATOR:
				if (states.states[0] == CSVState::RECORD_SEPARATOR || states.states[0] == CSVState::NOT_SET) {
					if (T::EmptyLine(result, iterator.pos.buffer_pos)) {
						iterator.pos.buffer_pos++;
						bytes_read = iterator.pos.buffer_pos - start_pos;
						lines_read++;
						return;
					}
					lines_read++;

				} else if (states.states[0] != CSVState::CARRIAGE_RETURN) {
					if (T::IsCommentSet(result)) {
						if (T::UnsetComment(result, iterator.pos.buffer_pos)) {
							iterator.pos.buffer_pos++;
							bytes_read = iterator.pos.buffer_pos - start_pos;
							lines_read++;
							return;
						}
					} else {
						if (T::AddRow(result, iterator.pos.buffer_pos)) {
							iterator.pos.buffer_pos++;
							bytes_read = iterator.pos.buffer_pos - start_pos;
							lines_read++;
							return;
						}
					}
					lines_read++;
				}
				iterator.pos.buffer_pos++;
				break;
			case CSVState::CARRIAGE_RETURN:
				if (states.states[0] == CSVState::RECORD_SEPARATOR || states.states[0] == CSVState::NOT_SET) {
					if (T::EmptyLine(result, iterator.pos.buffer_pos)) {
						iterator.pos.buffer_pos++;
						bytes_read = iterator.pos.buffer_pos - start_pos;
						lines_read++;
						return;
					}
				} else if (states.states[0] != CSVState::CARRIAGE_RETURN) {
					if (T::IsCommentSet(result)) {
						if (T::UnsetComment(result, iterator.pos.buffer_pos)) {
							iterator.pos.buffer_pos++;
							bytes_read = iterator.pos.buffer_pos - start_pos;
							lines_read++;
							return;
						}
					} else if (!only_rn_newlines) {
						if (T::AddRow(result, iterator.pos.buffer_pos)) {
							iterator.pos.buffer_pos++;
							bytes_read = iterator.pos.buffer_pos - start_pos;
							lines_read++;
							return;
						}
					}
				}
				iterator.pos.buffer_pos++;
				lines_read++;
				break;
			case CSVState::DELIMITER:
				T::AddValue(result, iterator.pos.buffer_pos);
				iterator.pos.buffer_pos++;
				break;
			case CSVState::QUOTED: {
				if ((states.states[0] == CSVState::UNQUOTED || states.states[0] == CSVState::MAYBE_QUOTED) &&
				    has_escaped_value) {
					ever_escaped = true;
					T::SetEscaped(result);
				}
				ever_quoted = true;
				T::SetQuoted(result, iterator.pos.buffer_pos);
				iterator.pos.buffer_pos++;
				while (iterator.pos.buffer_pos + 8 < to_pos) {
					const uint64_t value =
					    Load<uint64_t>(reinterpret_cast<const_data_ptr_t>(&buffer_handle_ptr[iterator.pos.buffer_pos]));
					if (ContainsZeroByte((value ^ state_machine->transition_array.quote) &
					                     (value ^ state_machine->transition_array.escape))) {
						break;
					}
					iterator.pos.buffer_pos += 8;
				}

				while (state_machine->transition_array
				           .skip_quoted[static_cast<uint8_t>(buffer_handle_ptr[iterator.pos.buffer_pos])] &&
				       iterator.pos.buffer_pos < to_pos - 1) {
					iterator.pos.buffer_pos++;
				}
			} break;
			case CSVState::UNQUOTED: {
				if (states.states[0] == CSVState::MAYBE_QUOTED) {
					ever_escaped = true;
					T::SetEscaped(result);
				}
				T::SetUnquoted(result);
				iterator.pos.buffer_pos++;
				break;
			}
			case CSVState::ESCAPE:
			case CSVState::UNQUOTED_ESCAPE:
			case CSVState::ESCAPED_RETURN:
				T::SetEscaped(result);
				ever_escaped = true;
				iterator.pos.buffer_pos++;
				break;
			case CSVState::STANDARD: {
				iterator.pos.buffer_pos++;
				while (iterator.pos.buffer_pos + 8 < to_pos) {
					uint64_t value =
					    Load<uint64_t>(reinterpret_cast<const_data_ptr_t>(&buffer_handle_ptr[iterator.pos.buffer_pos]));
					if (ContainsZeroByte((value ^ state_machine->transition_array.delimiter) &
					                     (value ^ state_machine->transition_array.new_line) &
					                     (value ^ state_machine->transition_array.carriage_return) &
					                     (value ^ state_machine->transition_array.escape) &
					                     (value ^ state_machine->transition_array.comment))) {
						break;
					}
					iterator.pos.buffer_pos += 8;
				}
				while (state_machine->transition_array
				           .skip_standard[static_cast<uint8_t>(buffer_handle_ptr[iterator.pos.buffer_pos])] &&
				       iterator.pos.buffer_pos < to_pos - 1) {
					iterator.pos.buffer_pos++;
				}
				break;
			}
			case CSVState::QUOTED_NEW_LINE:
				T::QuotedNewLine(result);
				iterator.pos.buffer_pos++;
				break;
			case CSVState::COMMENT: {
				T::SetComment(result, iterator.pos.buffer_pos);
				iterator.pos.buffer_pos++;
				while (iterator.pos.buffer_pos + 8 < to_pos) {
					const uint64_t value =
					    Load<uint64_t>(reinterpret_cast<const_data_ptr_t>(&buffer_handle_ptr[iterator.pos.buffer_pos]));
					if (ContainsZeroByte((value ^ state_machine->transition_array.new_line) &
					                     (value ^ state_machine->transition_array.carriage_return))) {
						break;
					}
					iterator.pos.buffer_pos += 8;
				}
				while (state_machine->transition_array
				           .skip_comment[static_cast<uint8_t>(buffer_handle_ptr[iterator.pos.buffer_pos])] &&
				       iterator.pos.buffer_pos < to_pos - 1) {
					iterator.pos.buffer_pos++;
				}
				break;
			}
			default:
				iterator.pos.buffer_pos++;
				break;
			}
		}
		bytes_read = iterator.pos.buffer_pos - start_pos;
	}